

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

EngineFactoryEntry * adios2::core::IO::NoEngineEntry(string *e)

{
  function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
  *in_RSI;
  EngineFactoryEntry *in_RDI;
  string local_60 [8];
  string *in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,(string *)in_RSI);
  NoEngine(in_stack_ffffffffffffffa8);
  std::__cxx11::string::string(local_60,(string *)in_RSI);
  NoEngine(in_stack_ffffffffffffffa8);
  std::
  function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
  ::function(in_RSI);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

IO::EngineFactoryEntry IO::NoEngineEntry(std::string e) { return {NoEngine(e), NoEngine(e)}; }